

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

void __thiscall rengine::Signal<>::emit(Signal<> *this,SignalEmitter *emitter)

{
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *pvVar1;
  SignalBase *pSVar2;
  BucketBase *pBVar3;
  pointer ppBVar4;
  SignalBase *pSVar5;
  
  pvVar1 = emitter->m_buckets;
  if (pvVar1 != (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                 *)0x0) {
    for (ppBVar4 = (pvVar1->
                   super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppBVar4 !=
        (pvVar1->
        super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        )._M_impl.super__Vector_impl_data._M_finish; ppBVar4 = ppBVar4 + 1) {
      pBVar3 = *ppBVar4;
      if (pBVar3->signal == &this->super_SignalBase) goto LAB_0010f0a6;
    }
  }
  pBVar3 = (BucketBase *)0x0;
LAB_0010f0a6:
  if (pBVar3 != (BucketBase *)0x0) {
    pSVar2 = pBVar3[1].signal;
    for (pSVar5 = (SignalBase *)pBVar3[1]._vptr_BucketBase; pSVar5 != pSVar2; pSVar5 = pSVar5 + 1) {
      (**(code **)(*pSVar5->_vptr_SignalBase + 0x10))();
    }
  }
  return;
}

Assistant:

void emit(SignalEmitter *emitter, Arguments ... args)
    {
        if (Bucket *bucket = findBucket(emitter)) {
            for (auto handler : bucket->handlers)
                handler->onSignal(args...);
        }
    }